

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_aggregate.cpp
# Opt level: O2

SourceResultType __thiscall
duckdb::PhysicalHashAggregate::GetData
          (PhysicalHashAggregate *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSourceInput *input)

{
  LocalSourceState *this_00;
  GlobalSourceState *pGVar1;
  SourceResultType SVar2;
  idx_t iVar3;
  reference this_01;
  reference this_02;
  reference this_03;
  type sink_p;
  LocalSourceState local_b0;
  mutex *local_a8;
  DataChunk *local_a0;
  mutex *local_98;
  vector<duckdb::HashAggregateGroupingData,_true> *local_90;
  vector<duckdb::unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>,_true>
  *local_88;
  pointer local_80;
  ExecutionContext *local_78;
  OperatorSourceInput *local_70;
  PhysicalHashAggregate *local_68;
  const_reference local_60;
  OperatorSourceInput source_input;
  unique_lock<std::mutex> guard;
  
  local_78 = context;
  local_80 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
             ::operator->(&(this->super_PhysicalOperator).sink_state);
  pGVar1 = input->global_state;
  this_00 = input->local_state + 1;
  local_90 = &this->groupings;
  local_80 = local_80 + 1;
  local_98 = &pGVar1[1].super_StateWithBlockableTasks.lock;
  local_88 = (vector<duckdb::unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>,_true>
              *)(input->local_state + 2);
  local_a8 = &(pGVar1->super_StateWithBlockableTasks).lock;
  local_a0 = chunk;
  local_70 = input;
  local_68 = this;
  while( true ) {
    if (this_00->_vptr_LocalSourceState == (_func_int **)0xffffffffffffffff) {
      optional_idx::optional_idx
                ((optional_idx *)&source_input,*(idx_t *)&pGVar1[1].super_StateWithBlockableTasks);
      this_00->_vptr_LocalSourceState = (_func_int **)source_input.global_state;
    }
    iVar3 = optional_idx::GetIndex((optional_idx *)this_00);
    if ((ulong)(((long)(local_68->groupings).
                       super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                       .
                       super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(local_68->groupings).
                      super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                      .
                      super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x70) <= iVar3) {
      return chunk->count == 0;
    }
    local_60 = vector<duckdb::HashAggregateGroupingData,_true>::get<true>(local_90,iVar3);
    this_01 = vector<duckdb::HashAggregateGroupingGlobalState,_true>::get<true>
                        ((vector<duckdb::HashAggregateGroupingGlobalState,_true> *)local_80,iVar3);
    this_02 = vector<duckdb::unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>,_true>
              ::get<true>((vector<duckdb::unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>,_true>
                           *)local_98,iVar3);
    source_input.global_state =
         unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
         ::operator*(this_02);
    this_03 = vector<duckdb::unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>,_true>
              ::get<true>(local_88,iVar3);
    source_input.local_state =
         unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>::
         operator*(this_03);
    source_input.interrupt_state = local_70->interrupt_state;
    sink_p = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
             ::operator*(&this_01->table_state);
    chunk = local_a0;
    SVar2 = RadixPartitionedHashTable::GetData
                      (&local_60->table_data,local_78,local_a0,sink_p,&source_input);
    if (SVar2 == BLOCKED) {
      return BLOCKED;
    }
    if (chunk->count != 0) break;
    ::std::unique_lock<std::mutex>::unique_lock(&guard,local_a8);
    iVar3 = optional_idx::GetIndex((optional_idx *)this_00);
    optional_idx::optional_idx((optional_idx *)&local_b0,iVar3 + 1);
    this_00->_vptr_LocalSourceState = local_b0._vptr_LocalSourceState;
    iVar3 = optional_idx::GetIndex((optional_idx *)this_00);
    if (*(ulong *)&pGVar1[1].super_StateWithBlockableTasks < iVar3) {
      iVar3 = optional_idx::GetIndex((optional_idx *)this_00);
      LOCK();
      *(idx_t *)&pGVar1[1].super_StateWithBlockableTasks = iVar3;
      UNLOCK();
    }
    optional_idx::optional_idx
              ((optional_idx *)&local_b0,*(idx_t *)&pGVar1[1].super_StateWithBlockableTasks);
    this_00->_vptr_LocalSourceState = local_b0._vptr_LocalSourceState;
    ::std::unique_lock<std::mutex>::~unique_lock(&guard);
  }
  return HAVE_MORE_OUTPUT;
}

Assistant:

SourceResultType PhysicalHashAggregate::GetData(ExecutionContext &context, DataChunk &chunk,
                                                OperatorSourceInput &input) const {
	auto &sink_gstate = sink_state->Cast<HashAggregateGlobalSinkState>();
	auto &gstate = input.global_state.Cast<HashAggregateGlobalSourceState>();
	auto &lstate = input.local_state.Cast<HashAggregateLocalSourceState>();
	while (true) {
		if (!lstate.radix_idx.IsValid()) {
			lstate.radix_idx = gstate.state_index.load();
		}
		const auto radix_idx = lstate.radix_idx.GetIndex();
		if (radix_idx >= groupings.size()) {
			break;
		}

		auto &grouping = groupings[radix_idx];
		auto &radix_table = grouping.table_data;
		auto &grouping_gstate = sink_gstate.grouping_states[radix_idx];

		OperatorSourceInput source_input {*gstate.radix_states[radix_idx], *lstate.radix_states[radix_idx],
		                                  input.interrupt_state};
		auto res = radix_table.GetData(context, chunk, *grouping_gstate.table_state, source_input);
		if (res == SourceResultType::BLOCKED) {
			return res;
		}
		if (chunk.size() != 0) {
			return SourceResultType::HAVE_MORE_OUTPUT;
		}

		// move to the next table
		auto guard = gstate.Lock();
		lstate.radix_idx = lstate.radix_idx.GetIndex() + 1;
		if (lstate.radix_idx.GetIndex() > gstate.state_index) {
			// we have not yet worked on the table
			// move the global index forwards
			gstate.state_index = lstate.radix_idx.GetIndex();
		}
		lstate.radix_idx = gstate.state_index.load();
	}

	return chunk.size() == 0 ? SourceResultType::FINISHED : SourceResultType::HAVE_MORE_OUTPUT;
}